

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

void __thiscall dtc::fdt::property_value::write_dts(property_value *this,FILE *file)

{
  size_type sVar1;
  FILE *file_local;
  property_value *this_local;
  
  resolve_type(this);
  switch(this->type) {
  case STRING_LIST:
  case STRING:
  case CROSS_REFERENCE:
    write_as_string(this,file);
    break;
  case BINARY:
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->byte_data);
    if ((sVar1 & 3) == 0) {
      write_as_cells(this,file);
    }
    else {
      write_as_bytes(this,file);
    }
    break;
  case PHANDLE:
    write_as_cells(this,file);
    break;
  default:
    __assert_fail("0 && \"Invalid type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc",99,
                  "void dtc::fdt::property_value::write_dts(FILE *)");
  }
  return;
}

Assistant:

void
property_value::write_dts(FILE *file)
{
	resolve_type();
	switch (type)
	{
		default:
			assert(0 && "Invalid type");
		case STRING:
		case STRING_LIST:
		case CROSS_REFERENCE:
			write_as_string(file);
			break;
		case PHANDLE:
			write_as_cells(file);
			break;
		case BINARY:
			if (byte_data.size() % 4 == 0)
			{
				write_as_cells(file);
				break;
			}
			write_as_bytes(file);
			break;
	}
}